

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffghdt(fitsfile *fptr,int *exttype,int *status)

{
  FITSfile *pFVar1;
  int iVar2;
  int iVar3;
  
  if (0 < *status) {
    return *status;
  }
  iVar2 = fptr->HDUposition;
  if ((iVar2 == 0) && (fptr->Fptr->headend == 0)) {
    iVar3 = 0;
  }
  else {
    if (iVar2 == fptr->Fptr->curhdu) {
      if ((fptr->Fptr->datastart == -1) && (iVar2 = ffrdef(fptr,status), 0 < iVar2))
      goto LAB_0013ddf7;
    }
    else {
      ffmahd(fptr,iVar2 + 1,(int *)0x0,status);
    }
    pFVar1 = fptr->Fptr;
    iVar2 = pFVar1->hdutype;
    *exttype = iVar2;
    iVar3 = 0;
    if (pFVar1->compressimg == 0) {
      iVar3 = iVar2;
    }
  }
  *exttype = iVar3;
LAB_0013ddf7:
  return *status;
}

Assistant:

int ffghdt(fitsfile *fptr,      /* I - FITS file pointer             */
           int *exttype,        /* O - type of extension, 0, 1, or 2 */
                                /*  for IMAGE_HDU, ASCII_TBL, or BINARY_TBL */
           int *status)         /* IO - error status                 */
/*
  Return the type of the CHDU. This returns the 'logical' type of the HDU,
  not necessarily the physical type, so in the case of a compressed image
  stored in a binary table, this will return the type as an Image, not a
  binary table.
*/
{
    if (*status > 0)
        return(*status);

    if (fptr->HDUposition == 0 && (fptr->Fptr)->headend == 0) { 
         /* empty primary array is alway an IMAGE_HDU */
         *exttype = IMAGE_HDU;
    }
    else {
 
        /* reset position to the correct HDU if necessary */
        if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        {
            ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
        }
        else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        {
            /* rescan header if data structure is undefined */
            if ( ffrdef(fptr, status) > 0)               
                return(*status);
        }

        *exttype = (fptr->Fptr)->hdutype; /* return the type of HDU */

        /*  check if this is a compressed image */
        if ((fptr->Fptr)->compressimg)
            *exttype = IMAGE_HDU;
    }
    return(*status);
}